

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O3

void * fy_ptr_slow_path(fy_parser *fyp,size_t *leftp)

{
  int *widthp;
  void *pvVar1;
  fy_input *pfVar2;
  int left;
  uint uVar3;
  uint8_t *p;
  byte *ptr;
  
  pvVar1 = fyp->current_ptr;
  if (pvVar1 != (void *)0x0) {
    if (leftp == (size_t *)0x0) {
      return pvVar1;
    }
    *leftp = fyp->current_left;
    return pvVar1;
  }
  pfVar2 = fyp->current_input;
  if (pfVar2 == (fy_input *)0x0) {
    return (void *)0x0;
  }
  switch((pfVar2->cfg).type) {
  case fyit_file:
    pvVar1 = (pfVar2->field_11).file.addr;
    if (pvVar1 != (void *)0x0) {
      left = (int)(pfVar2->field_11).file.length - (int)fyp->current_input_pos;
      ptr = (byte *)((long)pvVar1 + fyp->current_input_pos);
      break;
    }
  case fyit_stream:
    left = (int)pfVar2->read - (int)fyp->current_input_pos;
    ptr = (byte *)(fyp->current_input_pos + (long)pfVar2->buffer);
    break;
  case fyit_memory:
  case fyit_alloc:
    left = (int)(pfVar2->cfg).field_2.memory.size - (int)fyp->current_input_pos;
    ptr = (byte *)((pfVar2->cfg).field_2.stream.name + fyp->current_input_pos);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                  ,0x5a,"const void *fy_ptr_slow_path(struct fy_parser *, size_t *)");
  }
  if (leftp != (size_t *)0x0) {
    *leftp = (long)left;
  }
  fyp->current_ptr = ptr;
  fyp->current_left = (long)left;
  widthp = &fyp->current_w;
  if (left < 1) {
    *widthp = 0;
    uVar3 = 0xffffffff;
  }
  else if ((char)*ptr < '\0') {
    uVar3 = fy_utf8_get_generic(ptr,left,widthp);
  }
  else {
    *widthp = 1;
    uVar3 = *ptr & 0x7f;
  }
  fyp->current_c = uVar3;
  return ptr;
}

Assistant:

const void *fy_ptr_slow_path(struct fy_parser *fyp, size_t *leftp) {
    struct fy_input *fyi;
    const void *p;
    int left;

    if (fyp->current_ptr) {
        if (leftp)
            *leftp = fyp->current_left;
        return fyp->current_ptr;
    }

    fyi = fyp->current_input;
    if (!fyi)
        return NULL;

    /* tokens cannot cross boundaries */
    switch (fyi->cfg.type) {
        case fyit_file:
            if (fyi->file.addr) {
                left = fyi->file.length - fyp->current_input_pos;
                p = fyi->file.addr + fyp->current_input_pos;
                break;
            }

            /* fall-through */

        case fyit_stream:
            left = fyi->read - fyp->current_input_pos;
            p = fyi->buffer + fyp->current_input_pos;
            break;

        case fyit_memory:
            left = fyi->cfg.memory.size - fyp->current_input_pos;
            p = fyi->cfg.memory.data + fyp->current_input_pos;
            break;

        case fyit_alloc:
            left = fyi->cfg.alloc.size - fyp->current_input_pos;
            p = fyi->cfg.alloc.data + fyp->current_input_pos;
            break;


        default:
            assert(0);    /* no streams */
            p = NULL;
            left = 0;
            break;
    }

    if (leftp)
        *leftp = left;

    fyp->current_ptr = p;
    fyp->current_left = left;
    fyp->current_c = fy_utf8_get(fyp->current_ptr, fyp->current_left, &fyp->current_w);

    return p;
}